

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringhelpers.h
# Opt level: O3

bool chibi::eat_word_v2(char **line,char **word)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  
  cVar1 = **line;
  pcVar4 = *line;
  while( true ) {
    if (cVar1 == '\0') {
      return false;
    }
    pcVar3 = pcVar4 + 1;
    iVar2 = isspace((int)cVar1);
    if (iVar2 == 0) break;
    *line = pcVar3;
    cVar1 = *pcVar3;
    pcVar4 = pcVar3;
  }
  if (cVar1 == '\"') {
    *line = pcVar3;
    *word = pcVar3;
    pcVar4 = *line;
    while ((cVar1 = *pcVar4, cVar1 != '\0' && (cVar1 != '\"'))) {
      pcVar4 = pcVar4 + 1;
      *line = pcVar4;
    }
  }
  else {
    *word = pcVar4;
    cVar1 = **line;
    pcVar4 = *line;
    while (cVar1 != '\0') {
      pcVar3 = pcVar4 + 1;
      iVar2 = isspace((int)cVar1);
      if (iVar2 != 0) {
        cVar1 = '\x01';
        goto LAB_0010c361;
      }
      *line = pcVar3;
      pcVar4 = pcVar3;
      cVar1 = *pcVar3;
    }
    cVar1 = '\0';
  }
LAB_0010c361:
  if (pcVar4 <= *word) {
    return false;
  }
  if (cVar1 != '\0') {
    *pcVar4 = '\0';
    pcVar4 = *line;
    *line = pcVar4 + 1;
    cVar1 = pcVar4[1];
    if (cVar1 == '\0') {
      return true;
    }
    pcVar4 = pcVar4 + 2;
    do {
      iVar2 = isspace((int)cVar1);
      if (iVar2 == 0) {
        return true;
      }
      *line = pcVar4;
      cVar1 = *pcVar4;
      pcVar4 = pcVar4 + 1;
    } while (cVar1 != '\0');
    return true;
  }
  return true;
}

Assistant:

static bool eat_word_v2(char *& line, const char *& word)
	{
		while (*line != 0 && is_whitespace(*line) == true)
			line++;
		
		if (*line == 0)
			return false;
		
		const bool isQuoted = *line == '"';

		if (isQuoted)
		{
			line++;

			word = line;
			
			while (*line != 0 && *line != '"')
				line++;
		}
		else
		{
			word = line;
			
			while (*line != 0 && is_whitespace(*line) == false)
				line++;
		}
		
		if (line > word)
		{
			// null-terminate the extracted text
			
			if (*line != 0)
			{
				*line = 0;
				line++;
			}

			// make sure to increment the line pointer until we reach non-whitespace territory again

			while (*line != 0 && is_whitespace(*line))
				line++;
			
			return true;
		}
		else
		{
			return false;
		}
	}